

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O2

bool __thiscall xmrig::CpuLaunchStatus::started(CpuLaunchStatus *this,IWorker *worker,bool ready)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar2;
  undefined7 in_register_00000011;
  pair<unsigned_long,_unsigned_long> pVar3;
  
  if ((int)CONCAT71(in_register_00000011,ready) == 0) {
    sVar2 = this->m_errors + 1;
    this->m_errors = sVar2;
  }
  else {
    iVar1 = (*worker->_vptr_IWorker[3])(worker);
    pVar3 = VirtualMemory::hugePages((VirtualMemory *)CONCAT44(extraout_var,iVar1));
    this->m_hugePages = this->m_hugePages + pVar3.first;
    this->m_pages = pVar3.second + this->m_pages;
    this->m_started = this->m_started + 1;
    iVar1 = (*worker->_vptr_IWorker[5])(worker);
    this->m_ways = this->m_ways + CONCAT44(extraout_var_00,iVar1);
    sVar2 = this->m_errors;
  }
  return sVar2 + this->m_started == this->m_threads;
}

Assistant:

inline bool started(IWorker *worker, bool ready)
    {
        if (ready) {
            auto hugePages = worker->memory()->hugePages();

            m_started++;
            m_hugePages += hugePages.first;
            m_pages     += hugePages.second;
            m_ways      += worker->intensity();
        }
        else {
            m_errors++;
        }

        return (m_started + m_errors) == m_threads;
    }